

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

void ConvexDecomposition::checkit(cbtHullTriangle *t)

{
  int iVar1;
  int a;
  int iVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  
  iVar1 = t->id;
  if ((-1 < (long)iVar1) && (iVar1 < DAT_00b98040)) {
    if (*(cbtHullTriangle **)(tris + (long)iVar1 * 8) != t) {
      __assert_fail("tris[t->id]==t",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x960,"void ConvexDecomposition::checkit(cbtHullTriangle *)");
    }
    uVar6 = 2;
    lVar3 = 0;
    while( true ) {
      if (lVar3 == 3) {
        return;
      }
      lVar5 = 0;
      if (lVar3 != 2) {
        lVar5 = lVar3 + 1;
      }
      iVar1 = (&(t->super_int3).x)[lVar5];
      a = (&(t->super_int3).x)[(uint)((int)uVar6 + (int)(uVar6 / 3) * -3)];
      if (iVar1 == a) {
        __assert_fail("a!=b",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                      ,0x967,"void ConvexDecomposition::checkit(cbtHullTriangle *)");
      }
      iVar2 = (&(t->n).x)[lVar3];
      if (((long)iVar2 < 0) || (DAT_00b98040 <= iVar2)) break;
      piVar4 = cbtHullTriangle::neib(*(cbtHullTriangle **)(tris + (long)iVar2 * 8),a,iVar1);
      uVar6 = (ulong)((int)uVar6 + 1);
      lVar3 = lVar3 + 1;
      if (*piVar4 != t->id) {
        __assert_fail("tris[t->n[i]]->neib(b,a) == t->id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                      ,0x968,"void ConvexDecomposition::checkit(cbtHullTriangle *)");
      }
    }
  }
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,
                "Type &ConvexDecomposition::Array<ConvexDecomposition::cbtHullTriangle *>::operator[](int) [Type = ConvexDecomposition::cbtHullTriangle *]"
               );
}

Assistant:

void checkit(cbtHullTriangle *t)
{
	int i;
	assert(tris[t->id]==t);
	for(i=0;i<3;i++)
	{
		int i1=(i+1)%3;
		int i2=(i+2)%3;
		int a = (*t)[i1];
		int b = (*t)[i2];
		assert(a!=b);
		assert( tris[t->n[i]]->neib(b,a) == t->id);
	}
}